

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v11::basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_>::move
          (basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_> *this,
          basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_> *other)

{
  char *pcVar1;
  char *pcVar2;
  ulong uVar3;
  size_t sVar4;
  ulong uVar5;
  
  pcVar2 = (other->super_buffer<char>).ptr_;
  uVar3 = (other->super_buffer<char>).size_;
  sVar4 = (other->super_buffer<char>).capacity_;
  pcVar1 = other->store_;
  if (pcVar2 == pcVar1) {
    (this->super_buffer<char>).ptr_ = this->store_;
    (this->super_buffer<char>).capacity_ = sVar4;
    if (uVar3 != 0) {
      uVar5 = 0;
      do {
        this->store_[uVar5] = pcVar1[uVar5];
        uVar5 = uVar5 + 1;
      } while (uVar3 != uVar5);
    }
  }
  else {
    (this->super_buffer<char>).ptr_ = pcVar2;
    (this->super_buffer<char>).capacity_ = sVar4;
    (other->super_buffer<char>).ptr_ = pcVar1;
    (other->super_buffer<char>).size_ = 0;
    (other->super_buffer<char>).capacity_ = 0;
  }
  if ((this->super_buffer<char>).capacity_ < uVar3) {
    (*(this->super_buffer<char>).grow_)(&this->super_buffer<char>,uVar3);
  }
  uVar5 = (this->super_buffer<char>).capacity_;
  if (uVar3 < uVar5) {
    uVar5 = uVar3;
  }
  (this->super_buffer<char>).size_ = uVar5;
  return;
}

Assistant:

FMT_CONSTEXPR20 void move(basic_memory_buffer& other) {
    alloc_ = std::move(other.alloc_);
    T* data = other.data();
    size_t size = other.size(), capacity = other.capacity();
    if (data == other.store_) {
      this->set(store_, capacity);
      detail::copy<T>(other.store_, other.store_ + size, store_);
    } else {
      this->set(data, capacity);
      // Set pointer to the inline array so that delete is not called
      // when deallocating.
      other.set(other.store_, 0);
      other.clear();
    }
    this->resize(size);
  }